

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

pattern * limitItem(void)

{
  pattern *rhs_00;
  pattern *rhs;
  pattern *lhs;
  
  rhs = featureItem();
  while (lookahead == 0x2c) {
    matchTok(0x2c);
    rhs_00 = featureItem();
    rhs = makeNode(rhs,rhs_00,300);
  }
  return rhs;
}

Assistant:

pattern* limitItem() {
   pattern *lhs, *rhs;
   
   lhs = featureItem();
   for (;;) {
      if (lookahead == ',') {
	 matchTok(',');
	 rhs = featureItem();
	 lhs = makeNode(lhs, rhs, OR_NODE);
      }
      else {
	 break;
      }
   }
   return lhs;
}